

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_16_2_fd512ddf comp)

{
  int iVar1;
  bool bVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  reference piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *this;
  T tmp;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> sift_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> sift;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> cur;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  int local_3c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> this_00;
  
  bVar2 = __gnu_cxx::operator==
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  if (!bVar2) {
    _Var3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff98), bVar2) {
      this_00._M_current = _Var3._M_current;
      local_38 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator-((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffd0);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_38);
      bVar2 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                        ((anon_class_16_2_fd512ddf *)this_00._M_current,
                         (HighsInt)((ulong)_Var3._M_current >> 0x20),(HighsInt)_Var3._M_current);
      if (bVar2) {
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &stack0xffffffffffffffd0);
        local_3c = *piVar4;
        do {
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_38);
          iVar1 = *piVar4;
          local_48 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator--((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                in_stack_ffffffffffffffa4);
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          *piVar4 = iVar1;
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff98);
          in_stack_ffffffffffffffac = in_stack_ffffffffffffffac & 0xffffff;
          if (bVar2) {
            in_stack_ffffffffffffffa8 = local_3c;
            this = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_38);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                      (this);
            bVar2 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                              ((anon_class_16_2_fd512ddf *)this_00._M_current,
                               (HighsInt)((ulong)_Var3._M_current >> 0x20),
                               (HighsInt)_Var3._M_current);
            in_stack_ffffffffffffffac = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffac);
          }
        } while ((char)(in_stack_ffffffffffffffac >> 0x18) != '\0');
        in_stack_ffffffffffffffa4 = local_3c;
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &stack0xffffffffffffffd0);
        *piVar4 = in_stack_ffffffffffffffa4;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffd8);
      _Var3._M_current = this_00._M_current;
    }
  }
  return;
}

Assistant:

inline void insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return;

        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
            }
        }
    }